

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

void add_shader_program(GLuint p_id,vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  GLuint local_30;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  ShaderProgram::ShaderProgram((ShaderProgram *)&local_48,p_shaders);
  local_28._M_impl.super__Vector_impl_data._M_start =
       local_48._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       local_48._M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = p_id;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderProgram>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int,ShaderProgram>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderProgram>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)ShaderDb::program_map);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void add_shader_program(
    const GLuint p_id,
    const std::vector<GLuint> &p_shaders) noexcept
{
    ShaderDb::program_map.emplace(
        std::make_pair(
            p_id,
            ShaderProgram(p_shaders)));
}